

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

GLenum __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetTypeGLenum(Type *this)

{
  uint uVar1;
  GLuint GVar2;
  GLenum *pGVar3;
  GLenum (*paGVar4) [4];
  TestError *this_00;
  ulong uVar5;
  
  uVar1 = this->m_n_columns;
  if (uVar1 == 0) {
    return 0;
  }
  GVar2 = this->m_n_rows;
  if (GVar2 - 5 < 0xfffffffc || 4 < uVar1) {
    return 0;
  }
  switch(this->m_basic_type) {
  case Float:
    paGVar4 = GetTypeGLenum::float_lut;
    break;
  case Double:
    paGVar4 = GetTypeGLenum::double_lut;
    break;
  case Int:
    uVar5 = (ulong)(GVar2 - 1);
    pGVar3 = GetTypeGLenum::int_lut;
    goto LAB_0087ad9b;
  case Uint:
    uVar5 = (ulong)(GVar2 - 1);
    pGVar3 = GetTypeGLenum::uint_lut;
    goto LAB_0087ad9b;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invliad enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x246);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar5 = (ulong)(GVar2 - 1);
  pGVar3 = paGVar4[uVar1 - 1];
LAB_0087ad9b:
  return (*(GLenum (*) [4])pGVar3)[uVar5];
}

Assistant:

GLenum Type::GetTypeGLenum() const
{
	static const GLenum float_lut[4][4] = {
		{ GL_FLOAT, GL_FLOAT_VEC2, GL_FLOAT_VEC3, GL_FLOAT_VEC4 },
		{ 0, GL_FLOAT_MAT2, GL_FLOAT_MAT2x3, GL_FLOAT_MAT2x4 },
		{ 0, GL_FLOAT_MAT3x2, GL_FLOAT_MAT3, GL_FLOAT_MAT3x4 },
		{ 0, GL_FLOAT_MAT4x2, GL_FLOAT_MAT4x3, GL_FLOAT_MAT4 },
	};

	static const GLenum double_lut[4][4] = {
		{ GL_DOUBLE, GL_DOUBLE_VEC2, GL_DOUBLE_VEC3, GL_DOUBLE_VEC4 },
		{ 0, GL_DOUBLE_MAT2, GL_DOUBLE_MAT2x3, GL_DOUBLE_MAT2x4 },
		{ 0, GL_DOUBLE_MAT3x2, GL_DOUBLE_MAT3, GL_DOUBLE_MAT3x4 },
		{ 0, GL_DOUBLE_MAT4x2, GL_DOUBLE_MAT4x3, GL_DOUBLE_MAT4 },
	};

	static const GLenum int_lut[4] = { GL_INT, GL_INT_VEC2, GL_INT_VEC3, GL_INT_VEC4 };

	static const GLenum uint_lut[4] = { GL_UNSIGNED_INT, GL_UNSIGNED_INT_VEC2, GL_UNSIGNED_INT_VEC3,
										GL_UNSIGNED_INT_VEC4 };

	GLenum result = 0;

	if ((1 > m_n_columns) || (1 > m_n_rows) || (4 < m_n_columns) || (4 < m_n_rows))
	{
		return 0;
	}

	switch (m_basic_type)
	{
	case Float:
		result = float_lut[m_n_columns - 1][m_n_rows - 1];
		break;
	case Double:
		result = double_lut[m_n_columns - 1][m_n_rows - 1];
		break;
	case Int:
		result = int_lut[m_n_rows - 1];
		break;
	case Uint:
		result = uint_lut[m_n_rows - 1];
		break;
	default:
		TCU_FAIL("Invliad enum");
	}

	return result;
}